

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

bool pztopology::TPZPrism::CheckProjectionForSingularity<double>
               (int *side,TPZVec<double> *xiInterior)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  TPZVec<double> *in_RSI;
  int *in_RDI;
  bool regularmap;
  double zeta;
  double eta;
  double qsi;
  double zero;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  bool local_31;
  
  dVar3 = pztopology::gTolerance;
  pdVar4 = TPZVec<double>::operator[](in_RSI,0);
  dVar1 = *pdVar4;
  pdVar4 = TPZVec<double>::operator[](in_RSI,1);
  dVar2 = *pdVar4;
  TPZVec<double>::operator[](in_RSI,2);
  local_31 = true;
  switch(*in_RDI) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    local_31 = true;
    break;
  case 6:
    local_31 = dVar3 <= ABS(dVar2 - 1.0);
    break;
  case 7:
    local_31 = dVar3 <= ABS(dVar1 + dVar2);
    break;
  case 8:
    local_31 = dVar3 <= ABS(dVar1 - 1.0);
    break;
  case 9:
  case 10:
  case 0xb:
    local_31 = true;
    break;
  case 0xc:
    local_31 = dVar3 <= ABS(dVar2 - 1.0);
    break;
  case 0xd:
    local_31 = dVar3 <= ABS(dVar1 + dVar2);
    break;
  case 0xe:
    local_31 = dVar3 <= ABS(dVar1 - 1.0);
    break;
  case 0xf:
    local_31 = true;
    break;
  case 0x10:
    local_31 = dVar3 <= ABS(dVar2 - 1.0);
    break;
  case 0x11:
    local_31 = dVar3 <= ABS(dVar1 + dVar2);
    break;
  case 0x12:
    local_31 = dVar3 <= ABS(dVar1 - 1.0);
    break;
  case 0x13:
  case 0x14:
    local_31 = true;
  }
  if (0x14 < *in_RDI) {
    std::operator<<((ostream *)&std::cout,
                    "Cant compute CheckProjectionForSingularity method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n"
                   );
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  return local_31;
}

Assistant:

bool TPZPrism::CheckProjectionForSingularity(const int &side, const TPZVec<T> &xiInterior) {
        double zero = pztopology::gTolerance;

        T qsi = xiInterior[0];
        T eta = xiInterior[1];
        T zeta = xiInterior[2];

        bool regularmap = true;
        switch(side)
        {
            case 0:
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
                regularmap = true;
                break;
            case 6://1D
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 7://1D
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 8://1D
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 9://1D
            case 10://1D
            case 11://1D
                regularmap = true;
                break;
            case 12://1D
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 13://1D
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 14://1D
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 15://2D - triangle
                regularmap = true;
                break;
            case 16://2D - quadrilateral
                if(fabs((T)(eta-1.)) < zero) regularmap = false;
                break;
            case 17://2D - quadrilateral
                if(fabs((T)(qsi+eta)) < zero) regularmap = false;
                break;
            case 18://2D - quadrilateral
                if(fabs((T)(qsi-1.)) < zero) regularmap = false;
                break;
            case 19:
            case 20:
                regularmap = true;
        }
        if(side > 20)
        {
            cout << "Cant compute CheckProjectionForSingularity method in TPZPrism class!\nParameter (SIDE) must be between 6 and 19!\nMethod Aborted!\n";
            DebugStop();
        }
        return regularmap;
    }